

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testReadUnpack(string *tempdir)

{
  int iVar1;
  __uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true> __s;
  __uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true> __s_00;
  ostream *poVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  exr_decode_pipeline_t *in_RCX;
  exr_context_t f;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> zptr;
  unique_ptr<float[],_std::default_delete<float[]>_> gptr;
  string fn;
  undefined8 local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,(allocator<char> *)&decoder);
  local_260 = 0;
  local_270 = 0;
  uStack_268 = 0;
  local_280 = 0;
  uStack_278 = 0;
  local_290 = 0;
  uStack_288 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  local_250 = 0;
  local_2b0 = 0x68;
  uStack_258 = 0xbf800000fffffffe;
  local_2a8 = err_cb;
  std::__cxx11::string::append((char *)&fn);
  iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_2b0);
  if (iVar1 == 0) {
    in_RCX = (exr_decode_pipeline_t *)0x2;
    iVar1 = exr_read_tile_chunk_info(f,0,4,2,0,0,&cinfo);
    if (iVar1 != 0) goto LAB_00135b66;
    in_RCX = &decoder;
    iVar1 = exr_decoding_initialize(f,0,&cinfo);
    if (iVar1 != 0) goto LAB_00135bc7;
    __s.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)operator_new__(0x480);
    gptr._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         __s.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    __s_00.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
    super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)
         operator_new__(0x240);
    zptr._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
    super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
         __s_00.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
         super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
    memset((void *)__s.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,0,0x480);
    memset((void *)__s_00.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl,0,0x240);
    ((decoder.channels)->field_12).decode_to_ptr =
         (uint8_t *)
         __s.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (decoder.channels)->user_line_stride = 0x30;
    (decoder.channels)->user_bytes_per_element = 4;
    (decoder.channels)->user_data_type = 2;
    (decoder.channels)->user_pixel_stride = 4;
    decoder.channels[1].field_12.decode_to_ptr =
         (uint8_t *)
         __s_00.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
         super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
    decoder.channels[1].user_line_stride = 0x18;
    in_RCX = (exr_decode_pipeline_t *)0x200010002;
    decoder.channels[1].user_bytes_per_element = 2;
    decoder.channels[1].user_data_type = 1;
    decoder.channels[1].user_pixel_stride = 2;
    iVar1 = exr_decoding_choose_default_routines(f,0);
    if (iVar1 != 0) goto LAB_00135c28;
    iVar1 = exr_decoding_run(f,0,&decoder);
    if (iVar1 == 0) {
      iVar1 = exr_decoding_destroy(f,&decoder);
      if (iVar1 == 0) {
        std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
                  (&zptr);
        std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&gptr);
        exr_finish(&f);
        std::__cxx11::string::~string((string *)&fn);
        return;
      }
      goto LAB_00135cea;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x247,0x32049f,(char *)in_RCX)
    ;
LAB_00135b66:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x24a,0x32049f,
                   (char *)in_RCX);
LAB_00135bc7:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x24e,0x32049f,
                   (char *)in_RCX);
LAB_00135c28:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x260,0x32049f,
                   (char *)in_RCX);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar3 = (char *)exr_get_default_error_message(iVar1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x262,0x32049f,(char *)in_RCX);
LAB_00135cea:
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar3 = (char *)exr_get_default_error_message(iVar1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x266,0x32049f,(char *)in_RCX);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testReadUnpack (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL (exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo));

    {
        exr_decode_pipeline_t decoder;
        EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));

        std::unique_ptr<float[]>    gptr{new float[24 * 12]};
        std::unique_ptr<uint16_t[]> zptr{new uint16_t[24 * 12]};
        memset (gptr.get (), 0, 24 * 12 * 4);
        memset (zptr.get (), 0, 24 * 12 * 2);
        decoder.channels[0].decode_to_ptr          = (uint8_t*) gptr.get ();
        decoder.channels[0].user_pixel_stride      = 4;
        decoder.channels[0].user_line_stride       = 4 * 12;
        decoder.channels[0].user_bytes_per_element = 4;
        decoder.channels[0].user_data_type         = EXR_PIXEL_FLOAT;
        decoder.channels[1].decode_to_ptr          = (uint8_t*) zptr.get ();
        decoder.channels[1].user_pixel_stride      = 2;
        decoder.channels[1].user_line_stride       = 2 * 12;
        decoder.channels[1].user_bytes_per_element = 2;
        decoder.channels[1].user_data_type         = EXR_PIXEL_HALF;

        EXRCORE_TEST_RVAL (
            exr_decoding_choose_default_routines (f, 0, &decoder));

        EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

        /* TODO: add actual comparison against C++ library */

        EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
    }

    exr_finish (&f);
}